

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void fill_window(deflate_state *s)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  z_streamp_conflict pzVar5;
  Bytef *pBVar6;
  uint uVar7;
  ushort *puVar8;
  uLong uVar9;
  ushort uVar10;
  ulong uVar11;
  uint len;
  uInt uVar12;
  ulong uVar14;
  size_t __n;
  ulg uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar13;
  
  uVar3 = s->w_size;
  uVar14 = (ulong)uVar3;
  uVar12 = s->lookahead;
  do {
    uVar19 = s->strstart;
    uVar16 = (int)s->window_size - (uVar12 + uVar19);
    if (s->w_size + (uVar3 - 0x106) <= uVar19) {
      memcpy(s->window,s->window + uVar14,uVar14);
      uVar1 = s->strstart;
      uVar2 = s->match_start;
      uVar19 = uVar1 - uVar3;
      s->strstart = uVar19;
      s->match_start = uVar2 - uVar3;
      s->block_start = s->block_start - uVar14;
      uVar18 = (ulong)s->hash_size;
      puVar8 = s->head + uVar18;
      do {
        puVar8 = puVar8 + -1;
        uVar10 = *puVar8 - (short)uVar3;
        if (*puVar8 < uVar3) {
          uVar10 = 0;
        }
        *puVar8 = uVar10;
        uVar7 = (int)uVar18 - 1;
        uVar18 = (ulong)uVar7;
      } while (uVar7 != 0);
      puVar8 = s->prev + (uVar14 - 1);
      uVar7 = uVar3;
      do {
        uVar10 = *puVar8 - (short)uVar3;
        if (*puVar8 < uVar3) {
          uVar10 = 0;
        }
        *puVar8 = uVar10;
        puVar8 = puVar8 + -1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar16 = uVar16 + uVar3;
    }
    pzVar5 = s->strm;
    uVar7 = pzVar5->avail_in;
    if (uVar7 == 0) {
      return;
    }
    uVar13 = s->lookahead;
    len = uVar16;
    if (uVar7 < uVar16) {
      len = uVar7;
    }
    if (uVar16 != 0) {
      pBVar6 = s->window;
      pzVar5->avail_in = uVar7 - len;
      iVar4 = pzVar5->state->wrap;
      if (iVar4 == 2) {
        uVar9 = crc32(pzVar5->adler,pzVar5->next_in,len);
LAB_0070b741:
        pzVar5->adler = uVar9;
      }
      else if (iVar4 == 1) {
        uVar9 = adler32(pzVar5->adler,pzVar5->next_in,len);
        goto LAB_0070b741;
      }
      uVar18 = (ulong)len;
      memcpy(pBVar6 + (ulong)uVar13 + (ulong)uVar19,pzVar5->next_in,uVar18);
      pzVar5->next_in = pzVar5->next_in + uVar18;
      pzVar5->total_in = pzVar5->total_in + uVar18;
      uVar13 = s->lookahead;
    }
    uVar12 = uVar13 + len;
    s->lookahead = uVar12;
    if (2 < uVar12) {
      uVar19 = (uint)s->window[s->strstart];
      s->ins_h = uVar19;
      s->ins_h = ((uint)s->window[s->strstart + 1] ^ uVar19 << ((byte)s->hash_shift & 0x1f)) &
                 s->hash_mask;
      if (0x105 < uVar12) break;
    }
  } while (s->strm->avail_in != 0);
  uVar14 = s->high_water;
  uVar18 = s->window_size;
  uVar11 = uVar18 - uVar14;
  if (uVar14 <= uVar18 && uVar11 != 0) {
    uVar17 = (ulong)uVar12 + (ulong)s->strstart;
    if (uVar14 < uVar17) {
      __n = uVar18 - uVar17;
      if (0x101 < __n) {
        __n = 0x102;
      }
      memset(s->window + uVar17,0,__n);
      uVar15 = __n + uVar17;
    }
    else {
      uVar18 = (uVar17 + 0x102) - uVar14;
      if (uVar17 + 0x102 < uVar14 || uVar18 == 0) {
        return;
      }
      if (uVar18 < uVar11) {
        uVar11 = uVar18;
      }
      memset(s->window + uVar14,0,uVar11 & 0xffffffff);
      uVar15 = uVar11 + s->high_water;
    }
    s->high_water = uVar15;
  }
  return;
}

Assistant:

local void fill_window(deflate_state *s)
{
    register unsigned n, m;
    register Posf *p;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;

            /* Slide the hash table (could be avoided with 32 bit values
               at the expense of memory usage). We slide even when level == 0
               to keep the hash table consistent if we switch back to level > 0
               later. (Using level 0 permanently is not an optimal usage of
               zlib, so we don't care about this pathological case.)
             */
            n = s->hash_size;
            p = &s->head[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
            } while (--n);

            n = wsize;
#ifndef FASTEST
            p = &s->prev[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
                /* If n is not on any hash chain, prev[n] is garbage but
                 * its value will never be used.
                 */
            } while (--n);
#endif
            more += wsize;
        }
        if (s->strm->avail_in == 0) return;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead >= MIN_MATCH) {
            s->ins_h = s->window[s->strstart];
            UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to MAX_MATCH since the longest match
     * routines allow scanning to strstart + MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        ulg curr = s->strstart + (ulg)(s->lookahead);
        ulg init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            zmemzero(s->window + curr, (unsigned)init);
            s->high_water = curr + init;
        }
        else if (s->high_water < (ulg)curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = (ulg)curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            zmemzero(s->window + s->high_water, (unsigned)init);
            s->high_water += init;
        }
    }
}